

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O2

unordered_map<unsigned_int,_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
* __thiscall
cimod::BinaryPolynomialModel<unsigned_int,_double>::GetVariablesToIntegers
          (unordered_map<unsigned_int,_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
           *__return_storage_ptr__,BinaryPolynomialModel<unsigned_int,_double> *this)

{
  if (this->relabel_flag_for_variables_to_integers_ == true) {
    GenerateVariablesToIntegers(__return_storage_ptr__,this);
  }
  else {
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_long>,_std::allocator<std::pair<const_unsigned_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_Hashtable(&__return_storage_ptr__->_M_h,&(this->variables_to_integers_)._M_h);
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<IndexType, int64_t> GetVariablesToIntegers() const {
      if ( relabel_flag_for_variables_to_integers_ ) {
        return GenerateVariablesToIntegers();
      } else {
        return variables_to_integers_;
      }
    }